

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfer.cc
# Opt level: O3

Node __thiscall verona::Infer::do_block(Infer *this,Node *block)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  TokenDef *pTVar2;
  _func_int **pp_Var3;
  element_type *peVar4;
  undefined8 this_00;
  undefined8 uVar5;
  bool bVar6;
  Token *pTVar7;
  int __flags;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  void *__child_stack;
  void *__child_stack_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_31;
  _func_int *p_Var8;
  element_type *peVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  NodeDef *pNVar11;
  _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>_>
  *__arg;
  _Alloc_hider arg;
  _func_int *p_Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Da_27;
  undefined4 extraout_XMM0_Da_28;
  undefined4 extraout_XMM0_Da_29;
  undefined4 extraout_XMM0_Da_30;
  undefined4 extraout_XMM0_Da_31;
  undefined4 extraout_XMM0_Da_32;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  undefined4 extraout_XMM0_Db_27;
  undefined4 extraout_XMM0_Db_28;
  undefined4 extraout_XMM0_Db_29;
  undefined4 extraout_XMM0_Db_30;
  undefined4 extraout_XMM0_Db_31;
  undefined4 extraout_XMM0_Db_32;
  Node NVar13;
  Btype type;
  WFLookup sel;
  Node ret;
  WFLookup args;
  Lookup l;
  shared_ptr<trieste::NodeDef> stmt;
  Node params;
  WFLookup rhs;
  BtypeDef *local_338;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_330;
  WFLookup local_328;
  _func_int *local_308;
  Token local_300;
  undefined1 local_2f8 [16];
  WFLookup local_2e8;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  Token local_2a8;
  _Base_ptr local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  Token local_270;
  Node local_268;
  undefined1 local_258 [16];
  undefined1 local_248 [88];
  element_type *local_1f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  Btype local_1e0;
  element_type *local_1d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  Btype local_1c0;
  Node local_1b0;
  Node local_1a0;
  Btype local_190;
  Btype local_180;
  Btype local_170;
  element_type *local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158;
  Btype local_150;
  Node local_140;
  element_type *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  element_type *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  Wellformed *local_110;
  element_type *local_108;
  Node local_100;
  Btype local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  NodeDef *local_d8;
  Btype local_d0;
  Node local_c0;
  Btype local_b0;
  Btype local_a0;
  Node local_90;
  undefined1 local_80 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  Node local_60;
  Token local_50;
  Token local_48;
  Node local_40;
  
  p_Var8 = (in_RDX._M_pi)->_vptr__Sp_counted_base[0xb];
  p_Var12 = (in_RDX._M_pi)->_vptr__Sp_counted_base[0xc];
  local_248._72_8_ = this;
  if (p_Var8 != p_Var12) {
    local_308 = p_Var12;
    local_248._80_8_ = in_RDX._M_pi;
    do {
      peVar9 = (element_type *)local_248._72_8_;
      local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)p_Var8;
      local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var8 + 8);
      if (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pTVar2 = ((local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->type_).def;
      if (pTVar2 == (TokenDef *)Bind) {
        local_2c8._0_8_ = Rhs;
        trieste::operator/((WFLookup *)(local_248 + 0x28),&local_268,(Token *)local_2c8);
        local_248._0_8_ = Type;
        trieste::operator/(&local_328,&local_268,(Token *)local_248);
        _Var10._M_pi = local_328.node.
                       super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
        if (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
            local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
              goto LAB_00228a0b;
            }
          }
          else {
            (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
          local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
LAB_00228a0b:
        local_2e8.wf = (Wellformed *)
                       local_328.node.
                       super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_2c8._0_8_ = (TokenDef *)0x0;
        local_2c8._8_8_ = (element_type *)0x0;
        local_2b8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2b8._8_8_ = local_2c8 + 8;
        local_2a0 = (_Base_ptr)0x0;
        local_338 = (BtypeDef *)0x0;
        __arg = (_Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>_>
                 *)local_2c8;
        local_2a8.def = (TokenDef *)local_2b8._8_8_;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<verona::BtypeDef,std::allocator<verona::BtypeDef>,std::shared_ptr<trieste::NodeDef>&,std::map<std::shared_ptr<trieste::NodeDef>,std::shared_ptr<verona::BtypeDef>,std::owner_less<void>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>const,std::shared_ptr<verona::BtypeDef>>>>&>
                  (&local_330,&local_338,(allocator<verona::BtypeDef> *)local_2f8,
                   (shared_ptr<trieste::NodeDef> *)(local_2f8 + 0x10),
                   (map<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>_>
                    *)local_2c8);
        std::
        _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>_>
                     *)local_2c8);
        if (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
        if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
        }
        if (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        p_Var12 = local_308;
        if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_248._48_8_ + 0x10))->
            _vptr__Sp_counted_base == (_func_int **)TypeTest) {
          local_a0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               block[3].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_a0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = block[3].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (local_a0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_a0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count =
                   (local_a0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_a0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count =
                   (local_a0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_b0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_338;
          local_b0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = local_330._M_pi;
          if (local_330._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
            }
          }
          check((Infer *)block,&local_a0,&local_b0);
          in_RDX._M_pi = extraout_RDX_05;
          _Var10._M_pi = local_a0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          in_XMM0_Da = extraout_XMM0_Da_07;
          in_XMM0_Db = extraout_XMM0_Db_07;
          if (local_b0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            in_RDX._M_pi = extraout_RDX_06;
            _Var10._M_pi = local_a0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            in_XMM0_Da = extraout_XMM0_Da_08;
            in_XMM0_Db = extraout_XMM0_Db_08;
          }
LAB_00228fb2:
          if ((NodeDef *)_Var10._M_pi != (NodeDef *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
            in_RDX._M_pi = extraout_RDX_13;
            in_XMM0_Da = extraout_XMM0_Da_16;
            in_XMM0_Db = extraout_XMM0_Db_16;
          }
        }
        else {
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_248._48_8_ + 0x10))->
              _vptr__Sp_counted_base == (_func_int **)Cast) {
            local_328.wf = (Wellformed *)Type;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_2c8,(WFLookup *)(local_248 + 0x28),(Token *)&local_328);
            p_Var12 = local_308;
            local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_2c8._8_8_;
            local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(flag *)(local_2b8._0_8_ + 8) = *(flag *)(local_2b8._0_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(flag *)(local_2b8._0_8_ + 8) = *(flag *)(local_2b8._0_8_ + 8) + 1;
              }
            }
            local_d0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_338;
            local_d0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_330._M_pi;
            if (local_330._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
              }
            }
            check((Infer *)block,&local_c0,&local_d0);
            in_RDX._M_pi = extraout_RDX_10;
            this_01._M_pi =
                 local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            in_XMM0_Da = extraout_XMM0_Da_13;
            in_XMM0_Db = extraout_XMM0_Db_13;
            if (local_d0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              in_RDX._M_pi = extraout_RDX_11;
              this_01._M_pi =
                   local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              in_XMM0_Da = extraout_XMM0_Da_14;
              in_XMM0_Db = extraout_XMM0_Db_14;
            }
LAB_00228fa0:
            _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_;
            if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
              in_RDX._M_pi = extraout_RDX_12;
              _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_;
              in_XMM0_Da = extraout_XMM0_Da_15;
              in_XMM0_Db = extraout_XMM0_Db_15;
            }
            goto LAB_00228fb2;
          }
          local_2c8._0_8_ = Move;
          local_2c8._8_8_ = Copy;
          pTVar7 = ::std::
                   __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                             (local_2c8,(Token *)local_2b8,
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              (local_248._48_8_ + 0x10));
          p_Var12 = local_308;
          if (pTVar7 != (Token *)local_2b8) {
            local_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._48_8_;
            local_d8 = (NodeDef *)local_248._56_8_;
            if ((NodeDef *)local_248._56_8_ != (NodeDef *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = &(((enable_shared_from_this<trieste::NodeDef> *)local_248._56_8_)->
                          _M_weak_this).
                          super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ;
                *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                UNLOCK();
              }
              else {
                p_Var1 = &(((enable_shared_from_this<trieste::NodeDef> *)local_248._56_8_)->
                          _M_weak_this).
                          super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ;
                *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
              }
            }
            gamma((verona *)&local_40,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
            local_f0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_338;
            local_f0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_330._M_pi;
            if (local_330._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
              }
            }
            check((Infer *)block,&local_40,&local_f0);
            in_RDX._M_pi = extraout_RDX_07;
            in_XMM0_Da = extraout_XMM0_Da_09;
            in_XMM0_Db = extraout_XMM0_Db_09;
            if (local_f0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_f0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              in_RDX._M_pi = extraout_RDX_08;
              in_XMM0_Da = extraout_XMM0_Da_10;
              in_XMM0_Db = extraout_XMM0_Db_10;
            }
            _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8;
            if (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              in_RDX._M_pi = extraout_RDX_09;
              _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8;
              in_XMM0_Da = extraout_XMM0_Da_11;
              in_XMM0_Db = extraout_XMM0_Db_11;
            }
            goto LAB_00228fb2;
          }
          pp_Var3 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_248._48_8_ + 0x10))->
                    _vptr__Sp_counted_base;
          if (pp_Var3 == (_func_int **)FieldRef) {
            local_2c8._0_8_ = TypeView;
            trieste::NodeDef::create((NodeDef *)local_258,(Token *)local_2c8);
            local_300.def = (TokenDef *)Ref;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_2c8,(WFLookup *)(local_248 + 0x28),&local_300);
            local_120 = (element_type *)local_2c8._8_8_;
            local_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(flag *)(local_2b8._0_8_ + 8) = *(flag *)(local_2b8._0_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(flag *)(local_2b8._0_8_ + 8) = *(flag *)(local_2b8._0_8_ + 8) + 1;
              }
            }
            gamma((verona *)&local_110,(double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
            local_248._32_8_ = local_108;
            if (local_108 == (element_type *)0x0) {
              local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)0x0;
            }
            else {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = &(local_108->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                          super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ;
                *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                UNLOCK();
                local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = local_108;
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var1 = &(local_108->super_enable_shared_from_this<trieste::NodeDef>).
                            _M_weak_this.
                            super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount;
                  *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                  UNLOCK();
                  goto LAB_00229179;
                }
              }
              else {
                p_Var1 = &(local_108->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                          super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ;
                *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
              }
              local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = local_108;
              p_Var1 = &(local_108->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                        super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
              *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            }
LAB_00229179:
            local_328.wf = local_110;
            if (local_110 != (Wellformed *)0x0) {
              ::std::
              vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              ::push_back((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                           *)(local_258._0_8_ + 0x58),(value_type *)&local_328);
            }
            if (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_328.node.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            }
            uVar5 = local_258._8_8_;
            this_00 = local_258._0_8_;
            local_258._0_8_ = (NodeDef *)0x0;
            local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pNVar11 = block[1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            local_48.def = (TokenDef *)Ident;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)(local_2f8 + 0x10),(WFLookup *)(local_248 + 0x28),&local_48);
            trieste::NodeDef::lookdown
                      ((Nodes *)local_248,pNVar11,
                       (Location *)
                       ((long)&((string *)
                               &(local_2e8.node.
                                 super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->super_enable_shared_from_this<trieste::NodeDef>)->field_2 +
                       8));
            local_50.def = (TokenDef *)Type;
            trieste::operator/(&local_328,(Node *)local_248._0_8_,&local_50);
            local_140.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            local_140.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
            if (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_328.node.
                      super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_328.node.
                      super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
              }
            }
            reftype((verona *)&local_130,&local_140);
            local_2f8._0_8_ = local_130;
            local_2f8._8_8_ = local_128;
            if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_128->_M_use_count = local_128->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_128->_M_use_count = local_128->_M_use_count + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)this_00,(Node *)local_2f8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_);
            }
            p_Var12 = local_308;
            local_100.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)this_00;
            local_100.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
            local_150.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_338;
            local_150.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_330._M_pi;
            if (local_330._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
              }
            }
            check((Infer *)block,&local_100,&local_150);
            if (local_150.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_150.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_100.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
            }
            if (local_140.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_140.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_328.node.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            ::std::
            vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ::~vector((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       *)local_248);
            in_RDX._M_pi = extraout_RDX_18;
            in_XMM0_Da = extraout_XMM0_Da_22;
            in_XMM0_Db = extraout_XMM0_Db_22;
            if (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_2e8.node.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              in_RDX._M_pi = extraout_RDX_19;
              in_XMM0_Da = extraout_XMM0_Da_23;
              in_XMM0_Db = extraout_XMM0_Db_23;
            }
            if ((element_type *)local_248._32_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._32_8_);
              in_RDX._M_pi = extraout_RDX_20;
              in_XMM0_Da = extraout_XMM0_Da_24;
              in_XMM0_Db = extraout_XMM0_Db_24;
            }
            if (local_108 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108);
              in_RDX._M_pi = extraout_RDX_21;
              in_XMM0_Da = extraout_XMM0_Da_25;
              in_XMM0_Db = extraout_XMM0_Db_25;
            }
            if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
              in_RDX._M_pi = extraout_RDX_22;
              in_XMM0_Da = extraout_XMM0_Da_26;
              in_XMM0_Db = extraout_XMM0_Db_26;
            }
            _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_);
              in_RDX._M_pi = extraout_RDX_23;
              _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_;
              in_XMM0_Da = extraout_XMM0_Da_27;
              in_XMM0_Db = extraout_XMM0_Db_27;
            }
            goto LAB_00228fb2;
          }
          if (pp_Var3 == (_func_int **)Conditional) {
            local_328.wf = (Wellformed *)If;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_2c8,(WFLookup *)(local_248 + 0x28),(Token *)&local_328);
            p_Var12 = local_308;
            local_160 = (element_type *)local_2c8._8_8_;
            local_158 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(flag *)(local_2b8._0_8_ + 8) = *(flag *)(local_2b8._0_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(flag *)(local_2b8._0_8_ + 8) = *(flag *)(local_2b8._0_8_ + 8) + 1;
              }
            }
            gamma((verona *)&local_60,(double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20));
            local_170.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 block[3].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_170.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = block[3].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
            if (local_170.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_170.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_170.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_170.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_170.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            check((Infer *)block,&local_60,&local_170);
            if (local_170.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_170.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_);
            }
            local_328.wf = (Wellformed *)True;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_2c8,(WFLookup *)(local_248 + 0x28),(Token *)&local_328);
            do_block((Infer *)(local_80 + 0x10),block);
            local_180.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_338;
            local_180.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_330._M_pi;
            if (local_330._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
              }
            }
            check((Infer *)block,(Node *)(local_80 + 0x10),&local_180);
            if (local_180.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_180.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_);
            }
            local_328.wf = (Wellformed *)False;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_2c8,(WFLookup *)(local_248 + 0x28),(Token *)&local_328);
            do_block((Infer *)local_80,block);
            local_190.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_338;
            local_190.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_330._M_pi;
            if (local_330._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
              }
            }
            check((Infer *)block,(Node *)local_80,&local_190);
            in_RDX._M_pi = extraout_RDX_24;
            this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
            in_XMM0_Da = extraout_XMM0_Da_28;
            in_XMM0_Db = extraout_XMM0_Db_28;
            if (local_190.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_190.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              in_RDX._M_pi = extraout_RDX_25;
              this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
              in_XMM0_Da = extraout_XMM0_Da_29;
              in_XMM0_Db = extraout_XMM0_Db_29;
            }
            goto LAB_00228fa0;
          }
          if (pp_Var3 == (_func_int **)Call) {
            local_2c8._0_8_ = Selector;
            trieste::wf::detail::WFLookup::operator/
                      (&local_328,(WFLookup *)(local_248 + 0x28),(Token *)local_2c8);
            __flags = 0x2d7180;
            in_RDX._M_pi = extraout_RDX_17;
            in_XMM0_Da = extraout_XMM0_Da_21;
            in_XMM0_Db = extraout_XMM0_Db_21;
            if (((local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->type_).def == (TokenDef *)FQFunction) {
              local_1a0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_1a0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi = local_328.node.
                       super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
              if (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_328.node.
                        super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_328.node.
                        super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
                }
              }
              resolve_fq((Lookup *)local_2c8,&local_1a0);
              if (local_1a0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1a0.
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_2f8._0_8_ = &Params;
              trieste::operator/((WFLookup *)(local_2f8 + 0x10),(Node *)local_2c8,(Token *)local_2f8
                                );
              _Var10._M_pi = local_2e8.node.
                             super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
              if (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_2e8.node.
                        super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_2e8.node.
                        super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
                }
              }
              if (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr == (element_type *)0x0) {
                local_248._0_8_ = (TokenDef *)0x0;
                local_248._8_8_ = (element_type *)0x0;
              }
              else {
                trieste::NodeDef::clone
                          ((NodeDef *)local_248,
                           (__fn *)local_2e8.node.
                                   super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr,__child_stack,__flags,__arg);
              }
              if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
              }
              if (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_2e8.node.
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_300.def = (TokenDef *)Type;
              trieste::operator/((WFLookup *)(local_2f8 + 0x10),(Node *)local_2c8,&local_300);
              _Var10._M_pi = local_2e8.node.
                             super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
              if (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_2e8.node.
                        super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_2e8.node.
                        super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
                }
              }
              if (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr == (element_type *)0x0) {
                local_2f8._0_8_ = (element_type *)0x0;
                local_2f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              else {
                trieste::NodeDef::clone
                          ((NodeDef *)local_2f8,
                           (__fn *)local_2e8.node.
                                   super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr,__child_stack_00,__flags,__arg);
              }
              if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
              }
              if (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_2e8.node.
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_300.def = (TokenDef *)Args;
              trieste::wf::detail::WFLookup::operator/
                        ((WFLookup *)(local_2f8 + 0x10),(WFLookup *)(local_248 + 0x28),&local_300);
              Lookup::sub((Lookup *)local_2c8,(Node *)local_248);
              Lookup::sub((Lookup *)local_2c8,(Node *)local_2f8);
              peVar9 = (element_type *)
                       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &((TokenDef *)(local_248._0_8_ + 0x50))->fl)->_M_pi;
              peVar4 = ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                       &((TokenDef *)(local_248._0_8_ + 0x60))->name)->_M_ptr;
              arg._M_p = (((element_type *)
                          ((long)local_2e8.node.
                                 super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x58))->origin_)._M_dataplus._M_p;
              if (((long)peVar4 - (long)peVar9 ==
                   (((element_type *)
                    ((long)local_2e8.node.
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                    0x58))->origin_)._M_string_length - (long)arg._M_p) &&
                 (local_300.def = (TokenDef *)block, peVar9 != peVar4)) {
                do {
                  bVar6 = do_block::anon_class_8_1_8991fb9c::operator()
                                    ((anon_class_8_1_8991fb9c *)&local_300,(Node *)peVar9,
                                     (Node *)arg._M_p);
                  peVar9 = (element_type *)&peVar9->type_;
                  arg._M_p = arg._M_p + 0x10;
                } while (bVar6 && peVar9 != peVar4);
              }
              local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_2f8._0_8_;
              local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)(local_2f8._8_8_ + 8) =
                       *(_Atomic_word *)(local_2f8._8_8_ + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)(local_2f8._8_8_ + 8) =
                       *(_Atomic_word *)(local_2f8._8_8_ + 8) + 1;
                }
              }
              local_1c0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   local_338;
              local_1c0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi = local_330._M_pi;
              if (local_330._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_330._M_pi)->_M_use_count = (local_330._M_pi)->_M_use_count + 1;
                }
              }
              check((Infer *)block,&local_1b0,&local_1c0);
              if (local_1c0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1c0.
                           super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1b0.
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_2e8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_2e8.node.
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_);
              }
              if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
              }
              ::std::
              _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
                           *)local_2b8);
              in_RDX._M_pi = extraout_RDX_26;
              in_XMM0_Da = extraout_XMM0_Da_30;
              in_XMM0_Db = extraout_XMM0_Db_30;
              if ((element_type *)local_2c8._8_8_ != (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_);
                in_RDX._M_pi = extraout_RDX_27;
                in_XMM0_Da = extraout_XMM0_Da_31;
                in_XMM0_Db = extraout_XMM0_Db_31;
              }
            }
            p_Var12 = local_308;
            if (local_328.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_328.node.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              in_RDX._M_pi = extraout_RDX_28;
              p_Var12 = local_308;
              in_XMM0_Da = extraout_XMM0_Da_32;
              in_XMM0_Db = extraout_XMM0_Db_32;
            }
          }
          else {
            local_2c8._0_8_ = Int;
            local_2c8._8_8_ = Bin;
            local_2b8._0_8_ = Oct;
            local_2b8._8_8_ = Hex;
            local_2a8.def = (TokenDef *)Float;
            local_2a0 = (_Base_ptr)HexFloat;
            local_298 = Char;
            local_290 = Escaped;
            local_288 = String;
            local_280 = Tuple;
            local_278 = LLVM;
            pTVar7 = ::std::
                     __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                               (local_2c8,&local_270,
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                (local_248._48_8_ + 0x10));
            in_RDX._M_pi = extraout_RDX_04;
            p_Var12 = local_308;
            in_XMM0_Da = extraout_XMM0_Da_06;
            in_XMM0_Db = extraout_XMM0_Db_06;
            if (pTVar7 == &local_270) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                            ,0x84,"Node verona::Infer::do_block(Node &)");
            }
          }
        }
        pNVar11 = (NodeDef *)local_248._56_8_;
        if (local_330._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_330._M_pi);
          in_RDX._M_pi = extraout_RDX_14;
          pNVar11 = (NodeDef *)local_248._56_8_;
          in_XMM0_Da = extraout_XMM0_Da_17;
          in_XMM0_Db = extraout_XMM0_Db_17;
        }
LAB_00228fd3:
        if (pNVar11 != (NodeDef *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar11);
          in_RDX._M_pi = extraout_RDX_15;
          in_XMM0_Da = extraout_XMM0_Da_18;
          in_XMM0_Db = extraout_XMM0_Db_18;
        }
      }
      else {
        if (pTVar2 == (TokenDef *)Return) {
          if (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              *(element_type **)((*(_func_int ***)local_248._80_8_)[0xc] + -0x10)) {
            __assert_fail("stmt == block->back()",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                          ,0x89,"Node verona::Infer::do_block(Node &)");
          }
          local_248._40_8_ = Ref;
          trieste::operator/((WFLookup *)local_2c8,&local_268,(Token *)(local_248 + 0x28));
          local_1d0 = (element_type *)local_2c8._8_8_;
          local_1c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(flag *)(local_2b8._0_8_ + 8) = *(flag *)(local_2b8._0_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(flag *)(local_2b8._0_8_ + 8) = *(flag *)(local_2b8._0_8_ + 8) + 1;
            }
          }
          gamma((verona *)&local_90,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          local_1e0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               block[2].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1e0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = block[2].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (local_1e0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1e0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_1e0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1e0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_1e0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          check((Infer *)block,&local_90,&local_1e0);
          in_RDX._M_pi = extraout_RDX_00;
          in_XMM0_Da = extraout_XMM0_Da_02;
          in_XMM0_Db = extraout_XMM0_Db_02;
          if (local_1e0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1e0.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            in_RDX._M_pi = extraout_RDX_01;
            in_XMM0_Da = extraout_XMM0_Da_03;
            in_XMM0_Db = extraout_XMM0_Db_03;
          }
          if (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            in_RDX._M_pi = extraout_RDX_02;
            in_XMM0_Da = extraout_XMM0_Da_04;
            in_XMM0_Db = extraout_XMM0_Db_04;
          }
          pNVar11 = (NodeDef *)local_2b8._0_8_;
          if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8);
            in_RDX._M_pi = extraout_RDX_03;
            pNVar11 = (NodeDef *)local_2b8._0_8_;
            in_XMM0_Da = extraout_XMM0_Da_05;
            in_XMM0_Db = extraout_XMM0_Db_05;
          }
          goto LAB_00228fd3;
        }
        if (pTVar2 == (TokenDef *)Move) {
          if (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              *(element_type **)((*(_func_int ***)local_248._80_8_)[0xc] + -0x10)) {
            __assert_fail("stmt == block->back()",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                          ,0x8e,"Node verona::Infer::do_block(Node &)");
          }
          if (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_1f0 = local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
          local_1e8 = local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
          gamma((verona *)local_248._72_8_,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
          in_RDX._M_pi = extraout_RDX_29;
          if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8);
            in_RDX._M_pi = extraout_RDX_30;
          }
          if (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            in_RDX._M_pi = extraout_RDX_31;
          }
          goto LAB_002298d4;
        }
        local_2c8._0_8_ = Class;
        local_2c8._8_8_ = TypeAlias;
        local_2b8._0_8_ = LLVM;
        local_2b8._8_8_ = Drop;
        pTVar7 = ::std::
                 __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                           (local_2c8,&local_2a8,
                            &(local_268.
                              super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->type_);
        in_RDX._M_pi = extraout_RDX;
        in_XMM0_Da = extraout_XMM0_Da;
        in_XMM0_Db = extraout_XMM0_Db;
        if (pTVar7 == &local_2a8) {
          __assert_fail("stmt->in({Class, TypeAlias, LLVM, Drop})",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                        ,0x93,"Node verona::Infer::do_block(Node &)");
        }
      }
      if (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_268.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        in_RDX._M_pi = extraout_RDX_16;
        in_XMM0_Da = extraout_XMM0_Da_19;
        in_XMM0_Db = extraout_XMM0_Db_19;
      }
      p_Var8 = p_Var8 + 0x10;
    } while (p_Var8 != p_Var12);
  }
  (((enable_shared_from_this<trieste::NodeDef> *)local_248._72_8_)->_M_weak_this).
  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (((enable_shared_from_this<trieste::NodeDef> *)local_248._72_8_)->_M_weak_this).
  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar9 = (element_type *)local_248._72_8_;
LAB_002298d4:
  NVar13.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  NVar13.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar9;
  return (Node)NVar13.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node do_block(Node& block)
    {
      for (auto stmt : *block)
      {
        if (stmt == Bind)
        {
          // TODO: literals
          auto rhs = stmt / Rhs;
          auto type = make_btype(stmt / Type);

          if (rhs == TypeTest)
            check(bool_type, type);
          else if (rhs == Cast)
            check(rhs / Type, type);
          else if (rhs->in({Move, Copy}))
            check(gamma(rhs), type);
          else if (rhs == FieldRef)
          {
            // TODO: Self substitution?
            // this is failing when `type` is a TypeVar, unclear why
            check(
              TypeView << -gamma(rhs / Ref)
                       << reftype(
                            cls->lookdown((rhs / Ident)->location()).front() /
                            Type),
              type);
          }
          else if (rhs == Conditional)
          {
            check(gamma(rhs / If), bool_type);
            check(do_block(rhs / True), type);
            check(do_block(rhs / False), type);
          }
          else if (rhs == Call)
          {
            auto sel = rhs / Selector;

            if (sel == FQFunction)
            {
              // TODO: may not have a function of this arity
              auto l = resolve_fq(sel);
              auto params = clone(l.def / Params);
              auto ret = clone(l.def / Type);
              auto args = rhs / Args;
              l.sub(params);
              l.sub(ret);

              (void)std::equal(
                params->begin(),
                params->end(),
                args->begin(),
                args->end(),
                [&](Node& param, Node& arg) {
                  check(gamma(arg), make_btype(param / Type));
                  return true;
                });

              check(ret, type);
            }
            else
            {
              // TODO: selector
            }
          }
          else if (rhs->in(
                     {Int,
                      Bin,
                      Oct,
                      Hex,
                      Float,
                      HexFloat,
                      Char,
                      Escaped,
                      String,
                      Tuple,
                      LLVM}))
          {
            // TODO:
          }
          else
          {
            assert(false);
          }
        }
        else if (stmt == Return)
        {
          assert(stmt == block->back());
          check(gamma(stmt / Ref), ret_type);
        }
        else if (stmt == Move)
        {
          assert(stmt == block->back());
          return gamma(stmt);
        }
        else
        {
          assert(stmt->in({Class, TypeAlias, LLVM, Drop}));
        }
      }

      return {};
    }